

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O1

Uint64 __thiscall
Diligent::CommandQueueVkImpl::SubmitCmdBuffer(CommandQueueVkImpl *this,VkCommandBuffer cmdBuffer)

{
  Uint64 UVar1;
  VkCommandBuffer local_50;
  VkSubmitInfo local_48;
  
  local_48.pCommandBuffers = &local_50;
  local_48.pNext = (void *)0x0;
  local_48.pSignalSemaphores = (VkSemaphore *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  local_48._4_4_ = 0;
  local_48._41_7_ = 0;
  local_48.commandBufferCount._0_1_ = cmdBuffer != (VkCommandBuffer)0x0;
  local_48.waitSemaphoreCount = 0;
  local_48._20_4_ = 0;
  local_48.signalSemaphoreCount = 0;
  local_48._60_4_ = 0;
  local_48.pWaitSemaphores = (VkSemaphore *)0x0;
  local_48.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  local_50 = cmdBuffer;
  UVar1 = Submit(this,&local_48);
  return UVar1;
}

Assistant:

Uint64 CommandQueueVkImpl::SubmitCmdBuffer(VkCommandBuffer cmdBuffer)
{
    VkSubmitInfo SubmitInfo{};
    SubmitInfo.sType              = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    SubmitInfo.commandBufferCount = cmdBuffer != VK_NULL_HANDLE ? 1 : 0;
    SubmitInfo.pCommandBuffers    = &cmdBuffer;
    SubmitInfo.waitSemaphoreCount = 0;       // the number of semaphores upon which to wait before executing the command buffers
    SubmitInfo.pWaitSemaphores    = nullptr; // a pointer to an array of semaphores upon which to wait before the command
                                             // buffers begin execution
    SubmitInfo.pWaitDstStageMask = nullptr;  // a pointer to an array of pipeline stages at which each corresponding
                                             // semaphore wait will occur
    SubmitInfo.signalSemaphoreCount = 0;     // the number of semaphores to be signaled once the commands specified in
                                             // pCommandBuffers have completed execution
    SubmitInfo.pSignalSemaphores = nullptr;  // a pointer to an array of semaphores which will be signaled when the
                                             // command buffers for this batch have completed execution

    return Submit(SubmitInfo);
}